

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codebook.c
# Opt level: O2

long vorbis_book_decodevs_add(codebook *book,float *a,oggpack_buffer *b,int n)

{
  long lVar1;
  oggpack_buffer *b_00;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  long lStack_50;
  oggpack_buffer *local_48;
  ulong local_40;
  ulong local_38;
  
  local_48 = b;
  uVar7 = 0;
  if (0 < book->used_entries) {
    lVar3 = book->dim;
    local_38 = (long)n / lVar3;
    lVar1 = -((long)(int)local_38 * 8 + 0xfU & 0xfffffffffffffff0);
    local_40 = local_38 & 0xffffffff;
    if ((int)local_38 < 1) {
      local_40 = uVar7;
    }
    for (; b_00 = local_48, local_40 != uVar7; uVar7 = uVar7 + 1) {
      *(undefined8 *)((long)&lStack_50 + lVar1) = 0x1ba045;
      lVar2 = decode_packed_entry_number(book,b_00);
      if (lVar2 == -1) {
        *(undefined8 *)((long)&lStack_50 + lVar1) = 0xffffffffffffffff;
        return *(long *)((long)&lStack_50 + lVar1);
      }
      lVar3 = book->dim;
      *(float **)((long)&local_48 + uVar7 * 8 + lVar1 + -0x48 + 0x48) =
           book->valuelist + lVar2 * lVar3;
    }
    if (lVar3 < 1) {
      lVar3 = 0;
    }
    lVar6 = (long)(int)local_38;
    lVar2 = 0;
    for (lVar4 = 0; lVar4 != lVar3; lVar4 = lVar4 + 1) {
      for (lVar5 = 0; (lVar5 < lVar6 && (lVar2 + lVar5 < (long)n)); lVar5 = lVar5 + 1) {
        a[lVar5] = *(float *)(*(long *)((long)&local_48 + lVar5 * 8 + lVar1 + -0x48 + 0x48) +
                             lVar4 * 4) + a[lVar5];
      }
      lVar2 = lVar2 + lVar6;
      a = a + lVar6;
    }
  }
  return 0;
}

Assistant:

long vorbis_book_decodevs_add(codebook *book,float *a,oggpack_buffer *b,int n){
  if(book->used_entries>0){
    int step=n/book->dim;
    long *entry = alloca(sizeof(*entry)*step);
    float **t = alloca(sizeof(*t)*step);
    int i,j,o;

    for (i = 0; i < step; i++) {
      entry[i]=decode_packed_entry_number(book,b);
      if(entry[i]==-1)return(-1);
      t[i] = book->valuelist+entry[i]*book->dim;
    }
    for(i=0,o=0;i<book->dim;i++,o+=step)
      for (j=0;o+j<n && j<step;j++)
        a[o+j]+=t[j][i];
  }
  return(0);
}